

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O1

uint32_t * Hacl_Bignum256_32_new_bn_from_bytes_be(uint32_t len,uint8_t *b)

{
  long lVar1;
  uint8_t *__src;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t *os;
  ulong uVar4;
  void *__s;
  uint uVar5;
  undefined8 uStack_50;
  uint auStack_48 [2];
  undefined1 *local_40;
  uint8_t *local_38;
  
  if (len != 0) {
    uVar5 = len - 1 >> 2;
    if (uVar5 != 0x3fffffff) {
      uVar5 = uVar5 + 1;
      uStack_50 = 0x1325de;
      puVar2 = (uint32_t *)calloc((ulong)uVar5,4);
      if (puVar2 == (uint32_t *)0x0) {
        return (uint32_t *)0x0;
      }
      uVar4 = (ulong)(uVar5 * 4);
      lVar1 = -(uVar4 + 0xf & 0xfffffffffffffff0);
      __s = (void *)((long)auStack_48 + lVar1);
      local_40 = (undefined1 *)auStack_48;
      local_38 = b;
      *(undefined8 *)((long)auStack_48 + lVar1 + -8) = 0x132610;
      memset(__s,0,uVar4);
      __src = local_38;
      *(undefined8 *)((long)auStack_48 + lVar1 + -8) = 0x132625;
      memcpy((void *)((long)__s + (uVar4 - len)),__src,(ulong)len);
      uVar4 = (ulong)(len - 1 & 0xfffffffc);
      puVar3 = puVar2;
      do {
        uVar5 = *(uint *)((long)__s + (uVar4 & 0xffffffff));
        *puVar3 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        uVar4 = uVar4 - 4;
        puVar3 = puVar3 + 1;
      } while (uVar4 != 0xfffffffffffffffc);
      return puVar2;
    }
  }
  return (uint32_t *)0x0;
}

Assistant:

uint32_t *Hacl_Bignum256_32_new_bn_from_bytes_be(uint32_t len, uint8_t *b)
{
  if (len == 0U || !((len - 1U) / 4U + 1U <= 1073741823U))
  {
    return NULL;
  }
  KRML_CHECK_SIZE(sizeof (uint32_t), (len - 1U) / 4U + 1U);
  uint32_t *res = (uint32_t *)KRML_HOST_CALLOC((len - 1U) / 4U + 1U, sizeof (uint32_t));
  if (res == NULL)
  {
    return res;
  }
  uint32_t *res1 = res;
  uint32_t *res2 = res1;
  uint32_t bnLen = (len - 1U) / 4U + 1U;
  uint32_t tmpLen = 4U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  memcpy(tmp + tmpLen - len, b, len * sizeof (uint8_t));
  for (uint32_t i = 0U; i < bnLen; i++)
  {
    uint32_t *os = res2;
    uint32_t u = load32_be(tmp + (bnLen - i - 1U) * 4U);
    uint32_t x = u;
    os[i] = x;
  }
  return res2;
}